

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticFacts.cpp
# Opt level: O1

void slang::ast::SemanticFacts::populateTimeScale
               (optional<slang::TimeScale> *timeScale,Scope *scope,
               optional<slang::TimeScale> directiveTimeScale,optional<slang::SourceRange> unitsRange
               ,optional<slang::SourceRange> precisionRange)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  byte bVar4;
  strong_ordering sVar5;
  optional<slang::TimeScale> oVar6;
  Symbol *pSVar7;
  SourceRange *pSVar8;
  Diagnostic *this;
  TimeScaleMagnitude in_CL;
  TimeUnit TVar9;
  TimeScaleValue TVar10;
  uint uVar11;
  Scope *pSVar12;
  ulong uVar13;
  string local_48;
  
  bVar2 = unitsRange.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
          super__Optional_payload_base<slang::SourceRange>._M_engaged;
  TVar9 = directiveTimeScale.super__Optional_base<slang::TimeScale,_true,_true>._M_payload.
          super__Optional_payload_base<slang::TimeScale>._M_payload._0_1_;
  if ((unitsRange.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
       super__Optional_payload_base<slang::SourceRange>._M_engaged != true) ||
     (precisionRange.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
      super__Optional_payload_base<slang::SourceRange>._M_engaged == false)) {
    pSVar7 = scope->thisSym;
    if (pSVar7->kind == CompilationUnit) {
      in_CL = directiveTimeScale.super__Optional_base<slang::TimeScale,_true,_true>._M_payload.
              super__Optional_payload_base<slang::TimeScale>._M_payload._1_1_;
      pSVar7 = (Symbol *)
               (ulong)((uint)directiveTimeScale.super__Optional_base<slang::TimeScale,_true,_true>.
                             _M_payload.super__Optional_payload_base<slang::TimeScale>._M_payload >>
                      0x10);
      uVar13 = (ulong)((uint5)directiveTimeScale.super__Optional_base<slang::TimeScale,_true,_true>.
                              _M_payload.super__Optional_payload_base<slang::TimeScale> >> 0x20);
      pSVar12 = (Scope *)(ulong)((uint)directiveTimeScale.
                                       super__Optional_base<slang::TimeScale,_true,_true>._M_payload
                                       .super__Optional_payload_base<slang::TimeScale>._M_payload >>
                                0x18);
    }
    else {
      uVar13 = 0;
      pSVar12 = scope;
    }
    uVar11 = (uint)pSVar12;
    bVar4 = (byte)pSVar7;
    if ((uVar13 & 1) == 0) {
      oVar6 = Scope::getTimeScale(scope);
      TVar9 = oVar6.super__Optional_base<slang::TimeScale,_true,_true>._M_payload.
              super__Optional_payload_base<slang::TimeScale>._M_payload._0_1_;
      in_CL = oVar6.super__Optional_base<slang::TimeScale,_true,_true>._M_payload.
              super__Optional_payload_base<slang::TimeScale>._M_payload._1_1_;
      bVar4 = oVar6.super__Optional_base<slang::TimeScale,_true,_true>._M_payload.
              super__Optional_payload_base<slang::TimeScale>._M_payload._2_1_;
      uVar11 = (uint)oVar6.super__Optional_base<slang::TimeScale,_true,_true>._M_payload.
                     super__Optional_payload_base<slang::TimeScale>._M_payload >> 0x18;
      uVar13 = (ulong)((uint5)oVar6.super__Optional_base<slang::TimeScale,_true,_true>._M_payload.
                              super__Optional_payload_base<slang::TimeScale> >> 0x20);
    }
    bVar3 = precisionRange.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
            super__Optional_payload_base<slang::SourceRange>._M_engaged;
    bVar1 = (timeScale->super__Optional_base<slang::TimeScale,_true,_true>)._M_payload.
            super__Optional_payload_base<slang::TimeScale>._M_engaged;
    if ((uVar13 & 1) == 0) {
      if (bVar1 == false) {
        return;
      }
      TVar9 = Nanoseconds;
      in_CL = One;
      uVar11 = 1;
      bVar4 = 3;
    }
    else if (bVar1 == false) {
      (timeScale->super__Optional_base<slang::TimeScale,_true,_true>)._M_payload.
      super__Optional_payload_base<slang::TimeScale>._M_payload =
           (_Storage<slang::TimeScale,_true>)0x1030103;
      (timeScale->super__Optional_base<slang::TimeScale,_true,_true>)._M_payload.
      super__Optional_payload_base<slang::TimeScale>._M_engaged = true;
    }
    if (bVar2 == false) {
      TVar10.magnitude = in_CL;
      TVar10.unit = TVar9;
      (timeScale->super__Optional_base<slang::TimeScale,_true,_true>)._M_payload.
      super__Optional_payload_base<slang::TimeScale>._M_payload._M_value.base = TVar10;
    }
    if (precisionRange.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
        super__Optional_payload_base<slang::SourceRange>._M_engaged == false) {
      (timeScale->super__Optional_base<slang::TimeScale,_true,_true>)._M_payload.
      super__Optional_payload_base<slang::TimeScale>._M_payload._M_value.precision =
           (TimeScaleValue)((ushort)bVar4 | (ushort)((uVar11 & 0xff) << 8));
    }
    if (((bVar2 | precisionRange.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
                  super__Optional_payload_base<slang::SourceRange>._M_engaged) == 1) &&
       (sVar5 = TimeScaleValue::operator<=>
                          (&(timeScale->super__Optional_base<slang::TimeScale,_true,_true>).
                            _M_payload.super__Optional_payload_base<slang::TimeScale>._M_payload.
                            _M_value.precision,(TimeScaleValue *)timeScale), '\0' < sVar5._M_value))
    {
      pSVar8 = (SourceRange *)&unitsRange;
      if (bVar3 != false) {
        pSVar8 = (SourceRange *)&precisionRange;
      }
      this = Scope::addDiag(scope,(DiagCode)0xb0004,*pSVar8);
      TimeScale::toString_abi_cxx11_(&local_48,(TimeScale *)timeScale);
      Diagnostic::operator<<(this,&local_48);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p != &local_48.field_2) {
        operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
      }
    }
  }
  return;
}

Assistant:

void SemanticFacts::populateTimeScale(std::optional<TimeScale>& timeScale, const Scope& scope,
                                      std::optional<TimeScale> directiveTimeScale,
                                      std::optional<SourceRange> unitsRange,
                                      std::optional<SourceRange> precisionRange) {
    // If no time unit was set, infer one based on the following rules:
    // - If the scope is nested (inside another definition), inherit from that definition.
    // - Otherwise use a `timescale directive if there is one.
    // - Otherwise, look for a time unit in the compilation scope.
    // - Finally use the compilation default.
    if (unitsRange && precisionRange)
        return;

    std::optional<TimeScale> ts;
    if (scope.asSymbol().kind == SymbolKind::CompilationUnit)
        ts = directiveTimeScale;

    if (!ts)
        ts = scope.getTimeScale();

    if (!ts) {
        // If the scope didn't have any portion of the timescale set yet,
        // then we'll just let it remain nullopt so clients know that we
        // are using the default. Otherwise we should use the built-in
        // default for the unset portion.
        if (!timeScale)
            return;

        // Defaults to 1ns/1ns
        ts.emplace();
    }
    else if (!timeScale) {
        timeScale.emplace();
    }

    if (!unitsRange)
        timeScale->base = ts->base;
    if (!precisionRange)
        timeScale->precision = ts->precision;

    if ((unitsRange || precisionRange) && timeScale->precision > timeScale->base) {
        auto range = precisionRange ? *precisionRange : *unitsRange;
        auto& diag = scope.addDiag(diag::InvalidInferredTimeScale, range);
        diag << timeScale->toString();
    }
}